

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void SldAddCommentKeyword(char *keyword)

{
  const_iterator __s;
  bool bVar1;
  allocator<char> local_59;
  value_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  const_iterator end;
  const_iterator begin;
  char *keyword_local;
  
  begin._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyword;
  if ((keyword == (char *)0x0) || (*keyword == '\0')) {
    if (pass == 3) {
      Error("[SLDOPT COMMENT] invalid keyword",lp,SUPPRESS);
    }
  }
  else if (pass == 1) {
    end = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::cbegin(&sldCommentKeywords_abi_cxx11_);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::cend(&sldCommentKeywords_abi_cxx11_);
    local_30 = end._M_current;
    local_20._M_current = local_38;
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                         (end._M_current,
                          (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_38,(char **)&begin);
    bVar1 = __gnu_cxx::operator==(&local_28,&local_20);
    __s = begin;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,(char *)__s._M_current,&local_59);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&sldCommentKeywords_abi_cxx11_,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
  }
  return;
}

Assistant:

void SldAddCommentKeyword(const char* keyword) {
	if (nullptr == keyword || !keyword[0]) {
		if (LASTPASS == pass) Error("[SLDOPT COMMENT] invalid keyword", lp, SUPPRESS);
		return;
	}
	if (1 == pass) {
		auto begin = sldCommentKeywords.cbegin();
		auto end = sldCommentKeywords.cend();
		// add keyword only if it is new (not included yet)
		if (std::find(begin, end, keyword) == end) sldCommentKeywords.push_back(keyword);
	}
}